

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

void __thiscall
Js::AsmJsModuleCompiler::AccumulateCompileTime(AsmJsModuleCompiler *this,Phases phase)

{
  Tick TVar1;
  TickDelta local_38;
  TickDelta td;
  AsmJsCompileTime curTime;
  
  TickDelta::TickDelta(&local_38);
  td.m_lnDelta = (int64)Tick::Now();
  local_38 = Tick::operator-((Tick *)&td,(Tick)(this->mCompileTimeLastTick).m_luTick);
  TVar1 = Tick::operator+(&this->mCompileTime,local_38);
  (this->mCompileTime).m_luTick = TVar1.m_luTick;
  (this->mCompileTimeLastTick).m_luTick = td.m_lnDelta;
  TVar1 = Tick::operator+((Tick *)(&this->mAsmArrayBuiltinUsedBV + (ulong)phase + 1),local_38);
  (&this->mAsmArrayBuiltinUsedBV)[(ulong)phase + 1].data[0].word = TVar1.m_luTick;
  return;
}

Assistant:

void AsmJsModuleCompiler::AccumulateCompileTime(AsmJsCompilation::Phases phase)
    {
        Js::TickDelta td;
        AsmJsCompileTime curTime = GetTick();
        td = curTime - mCompileTimeLastTick;
        mCompileTime = mCompileTime + td;
        mCompileTimeLastTick = curTime;
        mPhaseCompileTime[phase] = mPhaseCompileTime[phase] + td;
    }